

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

int untrap(boolean force)

{
  xchar *pxVar1;
  undefined1 *puVar2;
  boolean bVar3;
  char cVar4;
  byte bVar5;
  schar sVar6;
  xchar xVar7;
  int iVar8;
  uint uVar9;
  undefined8 in_RAX;
  undefined7 extraout_var;
  trap *ptVar10;
  uint uVar11;
  undefined8 in_RDX;
  obj *poVar12;
  int iVar13;
  char *pcVar14;
  undefined7 in_register_00000039;
  char *pcVar15;
  char *pcVar16;
  long lVar17;
  monst *pmVar18;
  int x;
  long lVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  schar dy;
  schar dx;
  schar dz;
  char qbuf [128];
  char the_trap [256];
  char local_1ca;
  char local_1c9;
  undefined4 local_1c8;
  undefined4 local_1c4;
  schar local_1bd;
  int local_1bc;
  char local_1b8 [128];
  char local_138 [264];
  
  local_1c4 = (undefined4)CONCAT71(in_register_00000039,force);
  local_1c8 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if ((((u.uprops[0x1c].intrinsic == 0) && (local_1c8 = 0, u.uprops[0x23].intrinsic != 0)) &&
      (u.uprops[0x24].extrinsic == 0)) &&
     (local_1c8 = (undefined4)CONCAT71((int7)((ulong)in_RDX >> 8),1), u.umonnum != u.umonster)) {
    bVar3 = dmgtype(youmonst.data,0x24);
    local_1c8 = (undefined4)CONCAT71(extraout_var,bVar3 == '\0');
  }
  iVar8 = getdir((char *)0x0,&local_1c9,&local_1ca,&local_1bd);
  if (iVar8 == 0) {
    return 0;
  }
  lVar19 = (long)u.ux + (long)local_1c9;
  lVar17 = (long)u.uy + (long)local_1ca;
  poVar12 = level->objects[lVar19][lVar17];
  pcVar14 = "are containers";
  if (poVar12 == (obj *)0x0) {
    bVar22 = true;
  }
  else {
    bVar20 = false;
    bVar22 = false;
    do {
      if ((poVar12->otyp & 0xfffeU) == 0xda) {
        if (local_1ca == '\0' && local_1c9 == '\0') {
LAB_0026c98c:
          if (bVar20) {
            bVar22 = false;
            goto LAB_0026ca28;
          }
          bVar20 = true;
          bVar22 = true;
        }
      }
      else if (poVar12->otyp == 0xdc && (local_1ca == '\0' && local_1c9 == '\0')) goto LAB_0026c98c;
      poVar12 = (poVar12->v).v_nexthere;
    } while (poVar12 != (obj *)0x0);
    bVar22 = !bVar22;
    pcVar14 = "are containers";
    if (bVar20) {
      pcVar14 = "is a container";
    }
  }
LAB_0026ca28:
  ptVar10 = level->lev_traps;
LAB_0026ca2f:
  x = (int)lVar19;
  iVar8 = (int)lVar17;
  if (ptVar10 != (trap *)0x0) {
    if ((x != ptVar10->tx) || (iVar8 != ptVar10->ty)) goto LAB_0026ca48;
    if ((ptVar10->field_0x8 & 0x20) != 0) {
      pcVar15 = the(defexplain[(ulong)((byte)ptVar10->field_0x8 & 0x1f) + 0x2f]);
      strcpy(local_138,pcVar15);
      if (!bVar22) {
        uVar9 = (byte)ptVar10->field_0x8 & 0x1f;
        if ((byte)((char)uVar9 - 0xbU) < 2) {
          pcVar14 = " that you\'re stuck in";
          if (u.utrap == 0) {
            pcVar14 = " while standing on the edge of it";
          }
          pline("You can\'t do much about %s%s.",local_138,pcVar14);
        }
        else {
          pcVar15 = an(defexplain[(ulong)uVar9 + 0x2f]);
          pcVar16 = "Disarm";
          if ((ptVar10->field_0x8 & 0x1f) == 0x13) {
            pcVar16 = "Remove";
          }
          sprintf(local_1b8,"There %s and %s here. %s %s?",pcVar14,pcVar15,pcVar16,local_138);
          cVar4 = yn_function(local_1b8,"ynq",'q');
          if (cVar4 != 'n') {
            if (cVar4 == 'q') {
              return 0;
            }
            goto LAB_0026cd71;
          }
        }
        bVar22 = true;
        goto LAB_0026ca5d;
      }
LAB_0026cd71:
      if (u.utrap != 0) {
        pcVar14 = "";
        if (u.uy == iVar8 && u.ux == x) {
          pcVar14 = " in it";
        }
        pline("You cannot deal with %s while trapped%s!",local_138,pcVar14);
        return 1;
      }
      bVar5 = ptVar10->field_0x8 & 0x1f;
      switch(bVar5) {
      case 1:
        iVar8 = 1;
        goto LAB_0026d37a;
      case 2:
        iVar8 = 7;
LAB_0026d37a:
        iVar8 = disarm_shooting_trap(ptVar10,iVar8,local_1c9,local_1ca);
        return iVar8;
      case 4:
        iVar8 = disarm_squeaky_board(ptVar10,local_1c9,local_1ca);
        return iVar8;
      case 5:
      case 0x13:
        iVar8 = disarm_holdingtrap(ptVar10,local_1c9,local_1ca);
        return iVar8;
      case 6:
        iVar8 = disarm_landmine(ptVar10,local_1c9,local_1ca);
        return iVar8;
      case 0xb:
      case 0xc:
        if (local_1ca == '\0' && local_1c9 == '\0') {
          pcVar14 = "You are already on the edge of the pit.";
        }
        else {
          pmVar18 = level->monsters[lVar19][lVar17];
          if ((pmVar18 != (monst *)0x0) && ((pmVar18->field_0x61 & 2) == 0)) {
            iVar8 = help_monster_out(pmVar18,ptVar10);
            return iVar8;
          }
          pcVar14 = "Try filling the pit instead.";
        }
        goto LAB_0026cea5;
      default:
        if (bVar5 == 0x18) {
          iVar8 = 8;
          goto LAB_0026d37a;
        }
      case 3:
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
        pcVar14 = "this";
        if (local_1ca != '\0' || local_1c9 != '\0') {
          pcVar14 = "that";
        }
        pcVar15 = "You cannot disable %s trap.";
      }
      goto LAB_0026d059;
    }
  }
  bVar22 = false;
LAB_0026ca5d:
  if (local_1c9 == '\0' && local_1ca == '\0') {
    pmVar18 = (monst *)level->objects[lVar19][lVar17];
    if (pmVar18 != (monst *)0x0) {
      bVar20 = (char)local_1c4 != '\0';
      bVar21 = (char)local_1c8 == '\0';
      do {
        if ((ushort)(*(short *)((long)&pmVar18->m_id + 2) - 0xdaU) < 3) {
          pcVar14 = doname((obj *)pmVar18);
          pcVar15 = simple_typename((int)*(short *)((long)&pmVar18->m_id + 2));
          pcVar15 = an(pcVar15);
          pcVar14 = safe_qbuf("",0x24,pcVar14,pcVar15,"a box");
          sprintf(local_1b8,"There is %s here. Check it for traps?",pcVar14);
          cVar4 = yn_function(local_1b8,"ynq",'q');
          if (cVar4 != 'n') {
            if (cVar4 == 'q') {
              return 0;
            }
            if ((u.usteed != (monst *)0x0) && (u.weapon_skills[0x27].skill < '\x02')) {
              pcVar14 = mon_nam(u.usteed);
              pcVar15 = "You aren\'t skilled enough to reach from %s.";
              iVar8 = 0;
              goto LAB_0026d05c;
            }
            if ((*(byte *)((long)pmVar18->mtrack + 7) & 0x80) == 0) {
LAB_0026cc21:
              if ((bVar21 || bVar20) || (uVar9 = mt_random(), 0x55555555 < uVar9 * -0x55555555)) {
LAB_0026ccd9:
                pcVar14 = xname((obj *)pmVar18);
                pcVar14 = the(pcVar14);
                pline("You find no traps on %s.",pcVar14);
                return 1;
              }
            }
            else if ((char)local_1c4 == '\0') {
              if ((char)local_1c8 != '\0') goto LAB_0026cc21;
              lVar17 = (long)u.ulevel;
              uVar9 = mt_random();
              if (9 < SUB164(ZEXT416(uVar9) % SEXT816(0x1f - lVar17),0)) goto LAB_0026ccd9;
            }
            pcVar14 = xname((obj *)pmVar18);
            pcVar14 = the(pcVar14);
            pline("You find a trap on %s!",pcVar14);
            if ((char)local_1c8 == '\0') {
              exercise(2,'\x01');
            }
            cVar4 = yn_function("Disarm it?","ynq",'q');
            bVar22 = true;
            if (cVar4 != 'n') {
              iVar8 = 1;
              if (cVar4 == 'q') {
                return 1;
              }
              if ((pmVar18->mtrack[3].y & 0x80U) != 0) {
                exercise(3,'\x01');
                sVar6 = acurr(3);
                iVar8 = sVar6 + u.ulevel;
                bVar22 = urole.malenum == 0x164;
                if ((char)local_1c4 == '\0') {
                  if ((((char)local_1c8 == '\0') && (u.uprops[0x25].intrinsic == 0)) &&
                     (u.uprops[0x25].extrinsic == 0)) {
                    xVar7 = level_difficulty(&u.uz);
                    uVar9 = mt_random();
                    if ((int)(uVar9 % ((int)(xVar7 / '\x02') + 0x4bU)) < iVar8 << bVar22)
                    goto LAB_0026d0b4;
                  }
                  chest_trap((obj *)pmVar18,3,'\x01');
                  return 1;
                }
LAB_0026d0b4:
                pline("You disarm it!");
                pxVar1 = &pmVar18->mtrack[3].y;
                *pxVar1 = *pxVar1 & 0x7f;
                return 1;
              }
              pcVar14 = xname((obj *)pmVar18);
              pcVar15 = "That %s was not trapped.";
              goto LAB_0026d05c;
            }
          }
        }
        pmVar18 = ((vptrs *)&pmVar18->data)->v_ocarry;
      } while (pmVar18 != (monst *)0x0);
    }
    pcVar14 = "You find no other traps here.";
    if (!bVar22) {
      pcVar14 = "You know of no traps here.";
    }
  }
  else {
    pmVar18 = level->monsters[lVar19][lVar17];
    if (((((pmVar18 != (monst *)0x0) && ((pmVar18->field_0x61 & 2) == 0)) &&
         ((pmVar18->m_ap_type == '\x01' &&
          ((pmVar18->mappearance == 0x1c || (pmVar18->mappearance == 0x1b)))))) &&
        (u.uprops[0x17].intrinsic == 0)) && (u.uprops[0x17].extrinsic == 0)) {
      stumble_onto_mimic(pmVar18,local_1c9,local_1ca);
      return 1;
    }
    if (level->locations[lVar19][lVar17].typ == '\x17') {
      uVar9 = *(uint *)&level->locations[lVar19][lVar17].field_0x6;
      uVar11 = uVar9 >> 4 & 0x1f;
      if (uVar11 == 2) {
        pcVar14 = "This door is safely open.";
      }
      else {
        if (uVar11 != 1) {
          if (uVar11 != 0) {
            if ((uVar9 >> 8 & 1) == 0) {
LAB_0026ce11:
              if ((((char)local_1c4 != '\0') || ((char)local_1c8 == '\0')) ||
                 (uVar9 = mt_random(), 0x55555555 < uVar9 * -0x55555555)) {
LAB_0026ce35:
                pline("You find no traps on the door.");
                return 1;
              }
            }
            else if ((char)local_1c4 == '\0') {
              if ((char)local_1c8 != '\0') goto LAB_0026ce11;
              iVar13 = 0x29 - u.ulevel;
              uVar9 = mt_random();
              if (9 < SUB164(ZEXT416(uVar9) % SEXT816((long)iVar13),0)) goto LAB_0026ce35;
            }
            pline("You find a trap on the door!");
            iVar13 = 1;
            exercise(2,'\x01');
            cVar4 = yn_function("Disarm it?","ynq",'q');
            if (cVar4 != 'y') {
              return 1;
            }
            if ((level->locations[lVar19][lVar17].field_0x7 & 1) != 0) {
              local_1bc = u.ulevel * 3;
              if (urole.malenum != 0x164) {
                local_1bc = u.ulevel;
              }
              exercise(3,'\x01');
              if ((char)local_1c4 == '\0') {
                if ((((char)local_1c8 == '\0') && (u.uprops[0x25].intrinsic == 0)) &&
                   (u.uprops[0x25].extrinsic == 0)) {
                  local_1bc = local_1bc + 0xf;
                  xVar7 = level_difficulty(&u.uz);
                  uVar9 = mt_random();
                  if ((int)(uVar9 % ((int)(xVar7 / '\x02') + 0x4bU)) < local_1bc) goto LAB_0026d15d;
                }
                pline("You set it off!");
                b_trapped("door",3);
                puVar2 = &level->locations[lVar19][lVar17].field_0x6;
                *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffe0f;
                unblock_point(x,iVar8);
                newsym(x,iVar8);
                pcVar14 = in_rooms(level,(xchar)lVar19,(xchar)lVar17,0x12);
                if (*pcVar14 != '\0') {
                  add_damage((xchar)lVar19,(xchar)lVar17,0);
                  return 1;
                }
                return 1;
              }
LAB_0026d15d:
              pline("You disarm it!");
              puVar2 = &level->locations[lVar19][lVar17].field_0x6;
              *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffeff;
              return 1;
            }
            pcVar14 = "This door was not trapped.";
            goto LAB_0026cea8;
          }
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
              if (((youmonst.data)->mflags1 & 0x1000) == 0) {
                pcVar14 = "see";
                goto LAB_0026d052;
              }
              goto LAB_0026cb1a;
            }
          }
          else {
LAB_0026cb1a:
            if (ublindf == (obj *)0x0) {
              pcVar14 = "feel";
              goto LAB_0026d052;
            }
          }
          pcVar14 = "feel";
          if (ublindf->oartifact == '\x1d') {
            pcVar14 = "see";
          }
LAB_0026d052:
          pcVar15 = "You %s no door there.";
LAB_0026d059:
          iVar8 = 0;
LAB_0026d05c:
          pline(pcVar15,pcVar14);
          return iVar8;
        }
        pcVar14 = "This door is broken.";
      }
    }
    else {
      for (ptVar10 = level->lev_traps; ptVar10 != (trap *)0x0; ptVar10 = ptVar10->ntrap) {
        if ((x == ptVar10->tx) && (iVar8 == ptVar10->ty)) {
          if ((ptVar10->field_0x8 & 0x20) != 0) {
            pcVar14 = "You cannot disable that trap.";
            goto LAB_0026cea5;
          }
          break;
        }
      }
      pcVar14 = "You know of no traps there.";
    }
  }
LAB_0026cea5:
  iVar13 = 0;
LAB_0026cea8:
  pline(pcVar14);
  return iVar13;
LAB_0026ca48:
  ptVar10 = ptVar10->ntrap;
  goto LAB_0026ca2f;
}

Assistant:

int untrap(boolean force)
{
	struct obj *otmp;
	boolean confused = (Confusion > 0 || Hallucination > 0);
	int x,y;
	int ch;
	struct trap *ttmp;
	struct monst *mtmp;
	boolean trap_skipped = FALSE;
	boolean box_here = FALSE;
	boolean deal_with_floor_trap = FALSE;
	char the_trap[BUFSZ], qbuf[QBUFSZ];
	int containercnt = 0;
	schar dx, dy, dz;

	if (!getdir(NULL, &dx, &dy, &dz))
	    return 0;
	x = u.ux + dx;
	y = u.uy + dy;

	for (otmp = level->objects[x][y]; otmp; otmp = otmp->nexthere) {
		if (Is_box(otmp) && !dx && !dy) {
			box_here = TRUE;
			containercnt++;
			if (containercnt > 1) break;
		}
	}

	if ((ttmp = t_at(level, x,y)) && ttmp->tseen) {
		deal_with_floor_trap = TRUE;
		strcpy(the_trap, the(trapexplain[ttmp->ttyp-1]));
		if (box_here) {
			if (ttmp->ttyp == PIT || ttmp->ttyp == SPIKED_PIT) {
			    pline("You can't do much about %s%s.",
					the_trap, u.utrap ?
					" that you're stuck in" :
					" while standing on the edge of it");
			    trap_skipped = TRUE;
			    deal_with_floor_trap = FALSE;
			} else {
			    sprintf(qbuf, "There %s and %s here. %s %s?",
				(containercnt == 1) ? "is a container" : "are containers",
				an(trapexplain[ttmp->ttyp-1]),
				ttmp->ttyp == WEB ? "Remove" : "Disarm", the_trap);
			    switch (ynq(qbuf)) {
				case 'q': return 0;
				case 'n': trap_skipped = TRUE;
					  deal_with_floor_trap = FALSE;
					  break;
			    }
			}
		}
		if (deal_with_floor_trap) {
		    if (u.utrap) {
			pline("You cannot deal with %s while trapped%s!", the_trap,
				(x == u.ux && y == u.uy) ? " in it" : "");
			return 1;
		    }
		    switch(ttmp->ttyp) {
			case BEAR_TRAP:
			case WEB:
				return disarm_holdingtrap(ttmp, dx, dy);
			case LANDMINE:
				return disarm_landmine(ttmp, dx, dy);
			case SQKY_BOARD:
				return disarm_squeaky_board(ttmp, dx, dy);
			case DART_TRAP:
				return disarm_shooting_trap(ttmp, DART, dx, dy);
			case SHURIKEN_TRAP:
				return disarm_shooting_trap(ttmp, SHURIKEN, dx, dy);
			case ARROW_TRAP:
				return disarm_shooting_trap(ttmp, ARROW, dx, dy);
			case PIT:
			case SPIKED_PIT:
				if (!dx && !dy) {
				    pline("You are already on the edge of the pit.");
				    return 0;
				}
				if (!(mtmp = m_at(level, x,y))) {
				    pline("Try filling the pit instead.");
				    return 0;
				}
				return help_monster_out(mtmp, ttmp);
			default:
				pline("You cannot disable %s trap.", (dx || dy) ? "that" : "this");
				return 0;
		    }
		}
	} /* end if */

	if (!dx && !dy) {
	    for (otmp = level->objects[x][y]; otmp; otmp = otmp->nexthere)
		if (Is_box(otmp)) {
		    sprintf(qbuf, "There is %s here. Check it for traps?",
			safe_qbuf("", sizeof("There is  here. Check it for traps?"),
				doname(otmp), an(simple_typename(otmp->otyp)), "a box"));
		    switch (ynq(qbuf)) {
			case 'q': return 0;
			case 'n': continue;
		    }
		    if (u.usteed && P_SKILL(P_RIDING) < P_BASIC) {
			pline("You aren't skilled enough to reach from %s.",
				mon_nam(u.usteed));
			return 0;
		    }
		    if ((otmp->otrapped && (force || (!confused
				&& rn2(MAXULEV + 1 - u.ulevel) < 10)))
		       || (!force && confused && !rn2(3))) {
			pline("You find a trap on %s!", the(xname(otmp)));
			if (!confused) exercise(A_WIS, TRUE);

			switch (ynq("Disarm it?")) {
			    case 'q': return 1;
			    case 'n': trap_skipped = TRUE;  continue;
			}

			if (otmp->otrapped) {
			    exercise(A_DEX, TRUE);
			    ch = ACURR(A_DEX) + u.ulevel;
			    if (Role_if (PM_ROGUE)) ch *= 2;
			    if (!force && (confused || Fumbling ||
				rnd(75 + level_difficulty(&u.uz) / 2) > ch)) {
				chest_trap(otmp, FINGER, TRUE);
			    } else {
				pline("You disarm it!");
				otmp->otrapped = 0;
			    }
			} else pline("That %s was not trapped.", xname(otmp));
			return 1;
		    } else {
			pline("You find no traps on %s.", the(xname(otmp)));
			return 1;
		    }
		}

	    pline(trap_skipped ? "You find no other traps here."
			       : "You know of no traps here.");
	    return 0;
	}

	if ((mtmp = m_at(level, x,y))			&&
		mtmp->m_ap_type == M_AP_FURNITURE	&&
		(mtmp->mappearance == S_hcdoor ||
			mtmp->mappearance == S_vcdoor)	&&
		!Protection_from_shape_changers)	 {

	    stumble_onto_mimic(mtmp, dx, dy);
	    return 1;
	}

	if (!IS_DOOR(level->locations[x][y].typ)) {
	    if ((ttmp = t_at(level, x,y)) && ttmp->tseen)
		pline("You cannot disable that trap.");
	    else
		pline("You know of no traps there.");
	    return 0;
	}

	switch (level->locations[x][y].doormask) {
	    case D_NODOOR:
		pline("You %s no door there.", Blind ? "feel" : "see");
		return 0;
	    case D_ISOPEN:
		pline("This door is safely open.");
		return 0;
	    case D_BROKEN:
		pline("This door is broken.");
		return 0;
	}

	if ((level->locations[x][y].doormask & D_TRAPPED
	     && (force ||
		 (!confused && rn2(MAXULEV - u.ulevel + 11) < 10)))
	    || (!force && confused && !rn2(3))) {
		pline("You find a trap on the door!");
		exercise(A_WIS, TRUE);
		if (ynq("Disarm it?") != 'y') return 1;
		if (level->locations[x][y].doormask & D_TRAPPED) {
		    ch = 15 + (Role_if (PM_ROGUE) ? u.ulevel*3 : u.ulevel);
		    exercise(A_DEX, TRUE);
		    if (!force && (confused || Fumbling ||
				     rnd(75 + level_difficulty(&u.uz) / 2) > ch)) {
			pline("You set it off!");
			b_trapped("door", FINGER);
			level->locations[x][y].doormask = D_NODOOR;
			unblock_point(x, y);
			newsym(x, y);
			/* (probably ought to charge for this damage...) */
			if (*in_rooms(level, x, y, SHOPBASE)) add_damage(x, y, 0L);
		    } else {
			pline("You disarm it!");
			level->locations[x][y].doormask &= ~D_TRAPPED;
		    }
		} else pline("This door was not trapped.");
		return 1;
	} else {
		pline("You find no traps on the door.");
		return 1;
	}
}